

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_compression_type(fitsfile *fptr,int ctype,int *status)

{
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  
  if (((((in_ESI == 0xb) || (in_ESI == 0x15)) || (in_ESI == 0x16)) ||
      ((in_ESI == 0x1f || (in_ESI == 0x29)))) ||
     ((in_ESI == 0x33 || ((in_ESI == -1 || (in_ESI == 0)))))) {
    *(int *)(*(long *)(in_RDI + 8) + 1000) = in_ESI;
  }
  else {
    ffpmsg((char *)0x1feca5);
    *in_RDX = 0x19d;
  }
  return *in_RDX;
}

Assistant:

int fits_set_compression_type(fitsfile *fptr,  /* I - FITS file pointer     */
       int ctype,    /* image compression type code;                        */
                     /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                     /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */
       int *status)  /* IO - error status                                   */
{
/*
   This routine specifies the image compression algorithm that should be
   used when writing a FITS image.  The image is divided into tiles, and
   each tile is compressed and stored in a row of at variable length binary
   table column.
*/

    if (ctype != RICE_1 && 
        ctype != GZIP_1 && 
        ctype != GZIP_2 && 
        ctype != PLIO_1 && 
        ctype != HCOMPRESS_1 && 
        ctype != BZIP2_1 && 
        ctype != NOCOMPRESS &&
	ctype != 0)
    {
	ffpmsg("unknown compression algorithm (fits_set_compression_type)");
	*status = DATA_COMPRESSION_ERR; 
    } else {
        (fptr->Fptr)->request_compress_type = ctype;
    }
    return(*status);
}